

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::CreateReplacementVariables
          (ScalarReplacementPass *this,Instruction *inst,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  this_00;
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  pointer this_01;
  size_type sVar7;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  local_d0;
  void *local_c8;
  Instruction **local_c0;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  local_b8;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  local_b0;
  uint local_a4;
  Instruction *pIStack_a0;
  uint32_t i_1;
  uint32_t local_94;
  ulong uStack_90;
  uint32_t element_type_id;
  uint local_84;
  undefined1 auStack_80 [4];
  uint32_t i;
  Instruction *local_78;
  uint32_t *local_70;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_68;
  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  *local_60;
  function<void_(unsigned_int_*)> local_58;
  uint32_t local_34;
  undefined1 local_30 [4];
  uint32_t elem;
  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  components_used;
  Instruction *type;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *replacements_local;
  Instruction *inst_local;
  ScalarReplacementPass *this_local;
  
  components_used._M_t.
  super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>,_true,_true>
        )GetStorageType(this,inst);
  GetUsedComponents((ScalarReplacementPass *)local_30,(Instruction *)this);
  local_34 = 0;
  OVar3 = opt::Instruction::opcode
                    ((Instruction *)
                     components_used._M_t.
                     super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                     .
                     super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
                     ._M_head_impl);
  this_00 = components_used;
  if (OVar3 - OpTypeVector < 2) {
    for (local_a4 = 0; uVar5 = (ulong)local_a4,
        uVar6 = GetNumElements(this,(Instruction *)
                                    components_used._M_t.
                                    super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
                                    ._M_head_impl), uVar5 != uVar6; local_a4 = local_a4 + 1) {
      uVar4 = opt::Instruction::GetSingleWordInOperand
                        ((Instruction *)
                         components_used._M_t.
                         super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                         .
                         super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
                         ._M_head_impl,0);
      CreateVariable(this,uVar4,inst,local_a4,replacements);
    }
  }
  else if (OVar3 == OpTypeArray) {
    for (local_84 = 0; uVar5 = (ulong)local_84,
        uVar6 = GetArrayLength(this,(Instruction *)
                                    components_used._M_t.
                                    super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
                                    ._M_head_impl), uVar5 != uVar6; local_84 = local_84 + 1) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_30);
      bVar2 = true;
      if (bVar1) {
        this_01 = std::
                  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                  ::operator->((unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                                *)local_30);
        uStack_90 = (ulong)local_84;
        sVar7 = std::
                unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
                count(this_01,(key_type *)&stack0xffffffffffffff70);
        bVar2 = sVar7 != 0;
      }
      if (bVar2) {
        uVar4 = opt::Instruction::GetSingleWordInOperand
                          ((Instruction *)
                           components_used._M_t.
                           super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                           .
                           super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
                           ._M_head_impl,0);
        CreateVariable(this,uVar4,inst,local_84,replacements);
      }
      else {
        local_94 = opt::Instruction::GetSingleWordInOperand
                             ((Instruction *)
                              components_used._M_t.
                              super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                              .
                              super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
                              ._M_head_impl,0);
        pIStack_a0 = GetUndef(this,local_94);
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back(replacements,&stack0xffffffffffffff60);
      }
    }
  }
  else {
    if (OVar3 != OpTypeStruct) {
      __assert_fail("false && \"Unexpected type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                    ,0x1aa,
                    "bool spvtools::opt::ScalarReplacementPass::CreateReplacementVariables(Instruction *, std::vector<Instruction *> *)"
                   );
    }
    local_70 = &local_34;
    local_60 = (unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                *)local_30;
    _auStack_80 = this;
    local_78 = inst;
    local_68 = replacements;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::ScalarReplacementPass::CreateReplacementVariables(spvtools::opt::Instruction*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>*)::__0,void>
              ((function<void(unsigned_int*)> *)&local_58,(anon_class_40_5_fe065afa *)auStack_80);
    opt::Instruction::ForEachInOperand
              ((Instruction *)
               this_00._M_t.
               super___uniq_ptr_impl<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
               .
               super__Head_base<0UL,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_false>
               ._M_head_impl,&local_58);
    std::function<void_(unsigned_int_*)>::~function(&local_58);
  }
  TransferAnnotations(this,inst,replacements);
  local_b8._M_current =
       (Instruction **)
       std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
       begin(replacements);
  local_c0 = (Instruction **)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end(replacements);
  local_c8 = (void *)0x0;
  local_b0 = std::
             find<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,decltype(nullptr)>
                       (local_b8,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                  )local_c0,&local_c8);
  local_d0._M_current =
       (Instruction **)
       std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
                 (replacements);
  bVar2 = __gnu_cxx::operator==(&local_b0,&local_d0);
  std::
  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  ::~unique_ptr((unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                 *)local_30);
  return bVar2;
}

Assistant:

bool ScalarReplacementPass::CreateReplacementVariables(
    Instruction* inst, std::vector<Instruction*>* replacements) {
  Instruction* type = GetStorageType(inst);

  std::unique_ptr<std::unordered_set<int64_t>> components_used =
      GetUsedComponents(inst);

  uint32_t elem = 0;
  switch (type->opcode()) {
    case spv::Op::OpTypeStruct:
      type->ForEachInOperand(
          [this, inst, &elem, replacements, &components_used](uint32_t* id) {
            if (!components_used || components_used->count(elem)) {
              CreateVariable(*id, inst, elem, replacements);
            } else {
              replacements->push_back(GetUndef(*id));
            }
            elem++;
          });
      break;
    case spv::Op::OpTypeArray:
      for (uint32_t i = 0; i != GetArrayLength(type); ++i) {
        if (!components_used || components_used->count(i)) {
          CreateVariable(type->GetSingleWordInOperand(0u), inst, i,
                         replacements);
        } else {
          uint32_t element_type_id = type->GetSingleWordInOperand(0);
          replacements->push_back(GetUndef(element_type_id));
        }
      }
      break;

    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeVector:
      for (uint32_t i = 0; i != GetNumElements(type); ++i) {
        CreateVariable(type->GetSingleWordInOperand(0u), inst, i, replacements);
      }
      break;

    default:
      assert(false && "Unexpected type.");
      break;
  }

  TransferAnnotations(inst, replacements);
  return std::find(replacements->begin(), replacements->end(), nullptr) ==
         replacements->end();
}